

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O2

void __thiscall RealPointIncrement::test_method(RealPointIncrement *this)

{
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar1;
  Scalar local_208;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_200;
  Scalar local_1d8 [3];
  void *local_1c0;
  Vector3d vx;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_198 [24];
  Vector3d vy;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  RealSpace R3;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_200.m_xpr = &vx;
  local_200.m_row = 0;
  local_200.m_col = 1;
  local_200.m_currentBlockRows = 1;
  vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = -7.0;
  local_1d8[0] = 2.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_200,local_1d8);
  local_208 = 1.2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar1,&local_208);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(&local_200);
  local_200.m_xpr = &vy;
  local_200.m_row = 0;
  local_200.m_col = 1;
  local_200.m_currentBlockRows = 1;
  vy.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0;
  local_1d8[0] = 2.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                     (&local_200,local_1d8);
  local_208 = 3.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar1,&local_208);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(&local_200);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            (local_198,&vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,(type *)0x0)
  ;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_200,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&vx,(type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_1d8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&vy,(type *)0x0);
  mnf::Manifold::retractation(&R3,local_198,&local_200,local_1d8);
  free(local_1c0);
  free((void *)local_200.m_currentBlockRows);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x58);
  local_200.m_row = local_200.m_row & 0xffffffffffffff00;
  local_200.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0013ab88;
  local_200.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_200.m_currentBlockRows = 0x12a264;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_d0 = "";
  local_1d8[0] = 1.48219693752374e-323;
  local_208 = (Scalar)CONCAT44(local_208._4_4_,3);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_200,&local_d8,0x58,1,2,local_1d8,"vx.size()",&local_208,"3");
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x59);
  local_200.m_row = local_200.m_row & 0xffffffffffffff00;
  local_200.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0013ab88;
  local_200.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_200.m_currentBlockRows = 0x12a264;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_100 = "";
  local_1d8[0]._0_4_ = 0xfffffffa;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,int>
            (&local_200,&local_108,0x59,1,2,&vx,"vx[0]",local_1d8,"-6");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x5a);
  local_200.m_row = local_200.m_row & 0xffffffffffffff00;
  local_200.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0013ab88;
  local_200.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_200.m_currentBlockRows = 0x12a264;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_130 = "";
  local_1d8[0] = (Scalar)CONCAT44(local_1d8[0]._4_4_,4);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,int>
            (&local_200,&local_138,0x5a,1,2,
             vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1,"vx[1]",local_1d8,"4");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x5b);
  local_200.m_row = local_200.m_row & 0xffffffffffffff00;
  local_200.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)&PTR__lazy_ostream_0013ab88;
  local_200.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_200.m_currentBlockRows = 0x12a264;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
  ;
  local_160 = "";
  local_1d8[0] = 4.2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_200,&local_168,0x5b,1,2,
             vx.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2,"vx[2]",local_1d8,"4.2");
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RealPointIncrement)
{
  RealSpace R3(3);
  Eigen::Vector3d vx;
  Eigen::Vector3d vy;
  vx << -7, 2, 1.2;
  vy << 1, 2, 3;
  R3.retractation(vx, vx, vy);
  BOOST_CHECK_EQUAL(vx.size(), 3);
  BOOST_CHECK_EQUAL(vx[0], -6);
  BOOST_CHECK_EQUAL(vx[1], 4);
  BOOST_CHECK_EQUAL(vx[2], 4.2);
}